

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

void PrintVector<std::__cxx11::string>
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *vec)

{
  pointer pbVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  lVar2 = 0;
  for (uVar3 = 0;
      pbVar1 = (vec->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(vec->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar3 = uVar3 + 1) {
    std::operator<<((ostream *)&std::cout,(string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
    if (uVar3 != ((long)(vec->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                  (long)(vec->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
      std::operator<<((ostream *)&std::cout,", ");
    }
    lVar2 = lVar2 + 0x20;
  }
  return;
}

Assistant:

void PrintVector(std::vector< T > vec){
	std::cout << std::endl;
	for (int i = 0; i < vec.size(); i++){
		std::cout << vec[i];
		if (i != vec.size() - 1)
			std::cout << ", ";
	}
}